

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_32sto15u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  OPJ_INT32 OVar6;
  ulong uVar7;
  sbyte sVar8;
  uint uVar9;
  OPJ_BYTE *pOVar10;
  uint uVar11;
  
  uVar7 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      uVar11 = pSrc[uVar7];
      uVar9 = pSrc[uVar7 + 1];
      uVar1 = pSrc[uVar7 + 2];
      uVar2 = pSrc[uVar7 + 3];
      uVar3 = pSrc[uVar7 + 4];
      uVar4 = pSrc[uVar7 + 5];
      uVar5 = pSrc[uVar7 + 6];
      OVar6 = pSrc[uVar7 + 7];
      *pDst = (OPJ_BYTE)(uVar11 >> 7);
      pDst[1] = (byte)(uVar9 >> 0xe) | (char)uVar11 * '\x02';
      pDst[2] = (OPJ_BYTE)(uVar9 >> 6);
      pDst[3] = (byte)(uVar1 >> 0xd) | (byte)(uVar9 << 2);
      pDst[4] = (OPJ_BYTE)(uVar1 >> 5);
      pDst[5] = (byte)(uVar2 >> 0xc) | (byte)(uVar1 << 3);
      pDst[6] = (OPJ_BYTE)(uVar2 >> 4);
      pDst[7] = (byte)(uVar3 >> 0xb) | (byte)(uVar2 << 4);
      pDst[8] = (OPJ_BYTE)(uVar3 >> 3);
      pDst[9] = (byte)(uVar4 >> 10) | (byte)(uVar3 << 5);
      pDst[10] = (OPJ_BYTE)(uVar4 >> 2);
      pDst[0xb] = (byte)(uVar5 >> 9) | (byte)(uVar4 << 6);
      pDst[0xc] = (OPJ_BYTE)(uVar5 >> 1);
      pDst[0xd] = (byte)((uint)OVar6 >> 8) | (byte)(uVar5 << 7);
      pDst[0xe] = (OPJ_BYTE)OVar6;
      pDst = pDst + 0xf;
      uVar7 = uVar7 + 8;
    } while (uVar7 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    *pDst = (OPJ_BYTE)((uint)pSrc[uVar7] >> 7);
    uVar11 = pSrc[uVar7] & 0x7f;
    uVar9 = (uint)(length & 7);
    if (uVar9 == 1) {
      pOVar10 = pDst + 1;
      sVar8 = 1;
    }
    else {
      pDst[1] = (byte)((uint)pSrc[uVar7 + 1] >> 0xe) | (char)uVar11 * '\x02';
      uVar11 = pSrc[uVar7 + 1];
      pDst[2] = (OPJ_BYTE)(uVar11 >> 6);
      uVar11 = uVar11 & 0x3f;
      if (uVar9 < 3) {
        pOVar10 = pDst + 3;
        sVar8 = 2;
      }
      else {
        pDst[3] = (byte)((uint)pSrc[uVar7 + 2] >> 0xd) | (byte)(uVar11 << 2);
        uVar11 = pSrc[uVar7 + 2];
        pDst[4] = (OPJ_BYTE)(uVar11 >> 5);
        uVar11 = uVar11 & 0x1f;
        if (uVar9 == 3) {
          pOVar10 = pDst + 5;
          sVar8 = 3;
        }
        else {
          pDst[5] = (byte)((uint)pSrc[uVar7 + 3] >> 0xc) | (byte)(uVar11 << 3);
          uVar11 = pSrc[uVar7 + 3];
          pDst[6] = (OPJ_BYTE)(uVar11 >> 4);
          uVar11 = uVar11 & 0xf;
          if (uVar9 < 5) {
            pOVar10 = pDst + 7;
            sVar8 = 4;
          }
          else {
            pDst[7] = (byte)((uint)pSrc[uVar7 + 4] >> 0xb) | (byte)(uVar11 << 4);
            uVar11 = pSrc[uVar7 + 4];
            pDst[8] = (OPJ_BYTE)(uVar11 >> 3);
            uVar11 = uVar11 & 7;
            if (uVar9 == 5) {
              pOVar10 = pDst + 9;
              sVar8 = 5;
            }
            else {
              pDst[9] = (byte)((uint)pSrc[uVar7 + 5] >> 10) | (byte)(uVar11 << 5);
              uVar11 = pSrc[uVar7 + 5];
              pDst[10] = (OPJ_BYTE)(uVar11 >> 2);
              uVar11 = uVar11 & 3;
              if (uVar9 == 7) {
                pDst[0xb] = (byte)((uint)pSrc[uVar7 + 6] >> 9) | (byte)(uVar11 << 6);
                uVar11 = pSrc[uVar7 + 6];
                pDst[0xc] = (OPJ_BYTE)(uVar11 >> 1);
                pOVar10 = pDst + 0xd;
                uVar11 = uVar11 & 1;
                sVar8 = 7;
              }
              else {
                pOVar10 = pDst + 0xb;
                sVar8 = 6;
              }
            }
          }
        }
      }
    }
    *pOVar10 = (OPJ_BYTE)(uVar11 << sVar8);
  }
  return;
}

Assistant:

static void tif_32sto15u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 >> 7));
        *pDst++ = (OPJ_BYTE)((src0 << 1) | (src1 >> 14));
        *pDst++ = (OPJ_BYTE)((src1 >> 6));
        *pDst++ = (OPJ_BYTE)((src1 << 2) | (src2 >> 13));
        *pDst++ = (OPJ_BYTE)((src2 >> 5));
        *pDst++ = (OPJ_BYTE)((src2 << 3) | (src3 >> 12));
        *pDst++ = (OPJ_BYTE)((src3 >> 4));
        *pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 11));
        *pDst++ = (OPJ_BYTE)((src4 >> 3));
        *pDst++ = (OPJ_BYTE)((src4 << 5) | (src5 >> 10));
        *pDst++ = (OPJ_BYTE)((src5 >> 2));
        *pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 >> 9));
        *pDst++ = (OPJ_BYTE)((src6 >> 1));
        *pDst++ = (OPJ_BYTE)((src6 << 7) | (src7 >> 8));
        *pDst++ = (OPJ_BYTE)(src7);
    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS2((OPJ_UINT32)pSrc[i + 0], 15)
        if (length > 1U) {
            PUTBITS2((OPJ_UINT32)pSrc[i + 1], 15)
            if (length > 2U) {
                PUTBITS2((OPJ_UINT32)pSrc[i + 2], 15)
                if (length > 3U) {
                    PUTBITS2((OPJ_UINT32)pSrc[i + 3], 15)
                    if (length > 4U) {
                        PUTBITS2((OPJ_UINT32)pSrc[i + 4], 15)
                        if (length > 5U) {
                            PUTBITS2((OPJ_UINT32)pSrc[i + 5], 15)
                            if (length > 6U) {
                                PUTBITS2((OPJ_UINT32)pSrc[i + 6], 15)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}